

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockDifferentialWithAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  sbyte sVar1;
  int y;
  uint uVar2;
  int iVar3;
  uint8 *puVar4;
  long lVar5;
  long lVar6;
  int y_2;
  uint uVar7;
  long lVar8;
  uint8 *puVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint8 *puVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int y_3;
  
  lVar6 = (long)channelsRGB;
  puVar4 = img + 3;
  if (lVar6 == 3) {
    puVar4 = alpha;
  }
  uVar20 = block_part1 >> 1;
  uVar21 = block_part1 >> 0x13 & 0x1f;
  uVar2 = (block_part1 >> 0x1b) << 3 | block_part1 >> 0x1d;
  uVar7 = block_part1 >> 0xb & 0x1f;
  uVar18 = block_part1 >> 4 & 0xe;
  uVar19 = block_part2 & 0xffff;
  uVar15 = block_part2 >> 0x10;
  sVar1 = (lVar6 != 3) * '\x02';
  iVar23 = (uVar21 >> 2) + uVar21 * 8;
  iVar25 = (uVar7 >> 2) + uVar7 * 8;
  lVar8 = (long)starty;
  lVar16 = (long)width;
  lVar13 = (long)startx;
  if ((block_part1 & 1) == 0) {
    iVar3 = starty * width + startx;
    puVar22 = img + (lVar8 * lVar16 + lVar13) * lVar6 + 2;
    bVar14 = 0;
    for (; lVar5 = lVar8, puVar9 = puVar22, iVar12 = iVar3, lVar13 < startx + 2; lVar13 = lVar13 + 1
        ) {
      for (; lVar5 < starty + 4; lVar5 = lVar5 + 1) {
        uVar17 = uVar19 >> (bVar14 & 0x1f);
        uVar24 = (uVar17 & 1) + (uVar15 >> (bVar14 & 0x1f) & 1) * 2;
        uVar17 = -((uVar17 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar24] * 4 + (ulong)(uVar18 << 4));
        iVar10 = uVar17 + uVar2;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        puVar9[-2] = (uint8)iVar10;
        iVar10 = uVar17 + iVar23;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        puVar9[-1] = (uint8)iVar10;
        iVar10 = uVar17 + iVar25;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        iVar11 = iVar12 << sVar1;
        *puVar9 = (uint8)iVar10;
        if (((uVar20 & 1) == 0) && (uVar24 == 2)) {
          puVar4[iVar11] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar4[iVar11] = 0xff;
        }
        bVar14 = bVar14 + 1;
        puVar9 = puVar9 + lVar6 * lVar16;
        iVar12 = iVar12 + width;
      }
      iVar3 = iVar3 + 1;
      puVar22 = puVar22 + lVar6;
    }
  }
  else {
    iVar3 = starty * width + startx;
    puVar22 = img + (lVar8 * lVar16 + lVar13) * lVar6 + 2;
    bVar14 = 0;
    for (; lVar5 = lVar8, puVar9 = puVar22, iVar12 = iVar3, lVar13 < startx + 4; lVar13 = lVar13 + 1
        ) {
      for (; lVar5 < starty + 2; lVar5 = lVar5 + 1) {
        uVar17 = uVar19 >> (bVar14 & 0x1f);
        uVar24 = (uVar17 & 1) + (uVar15 >> (bVar14 & 0x1f) & 1) * 2;
        uVar17 = -((uVar17 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar24] * 4 + (ulong)(uVar18 << 4));
        iVar10 = uVar17 + uVar2;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        puVar9[-2] = (uint8)iVar10;
        iVar10 = uVar17 + iVar23;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        puVar9[-1] = (uint8)iVar10;
        iVar10 = uVar17 + iVar25;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        iVar11 = iVar12 << sVar1;
        *puVar9 = (uint8)iVar10;
        if (((uVar20 & 1) == 0) && (uVar24 == 2)) {
          puVar4[iVar11] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar4[iVar11] = 0xff;
        }
        bVar14 = bVar14 + 1;
        puVar9 = puVar9 + lVar6 * lVar16;
        iVar12 = iVar12 + width;
      }
      bVar14 = bVar14 + 2;
      iVar3 = iVar3 + 1;
      puVar22 = puVar22 + lVar6;
    }
  }
  uVar2 = ((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b);
  uVar21 = uVar21 + ((int)(block_part1 << 0xd) >> 0x1d);
  uVar7 = uVar7 + ((int)(block_part1 << 0x15) >> 0x1d);
  uVar18 = uVar2 * 8 & 0xff | (uVar2 & 0xff) >> 2;
  uVar2 = uVar21 * 8 & 0xff | (uVar21 & 0xff) >> 2;
  uVar21 = uVar7 * 8 & 0xff | (uVar7 & 0xff) >> 2;
  sVar1 = (channelsRGB != 3) * '\x02';
  lVar6 = (long)channelsRGB;
  if ((block_part1 & 1) == 0) {
    lVar8 = (long)(startx + 2);
    iVar23 = startx + starty * width + 2;
    puVar22 = img + (starty * lVar16 + lVar8) * lVar6 + 2;
    bVar14 = 8;
    for (; lVar13 = (long)starty, puVar9 = puVar22, iVar25 = iVar23, lVar8 < startx + 4;
        lVar8 = lVar8 + 1) {
      for (; lVar13 < starty + 4; lVar13 = lVar13 + 1) {
        uVar24 = uVar19 >> (bVar14 & 0x1f);
        uVar7 = (uVar24 & 1) + (uVar15 >> (bVar14 & 0x1f) & 1) * 2;
        uVar24 = -((uVar24 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar7] * 4 + (ulong)((uVar20 & 0xe) << 4));
        iVar3 = uVar24 + uVar18;
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        puVar9[-2] = (uint8)iVar3;
        iVar3 = uVar24 + uVar2;
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        puVar9[-1] = (uint8)iVar3;
        iVar3 = uVar24 + uVar21;
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        iVar12 = iVar25 << sVar1;
        *puVar9 = (uint8)iVar3;
        if (((uVar20 & 1) == 0) && (uVar7 == 2)) {
          puVar4[iVar12] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar4[iVar12] = 0xff;
        }
        bVar14 = bVar14 + 1;
        puVar9 = puVar9 + lVar16 * lVar6;
        iVar25 = iVar25 + width;
      }
      iVar23 = iVar23 + 1;
      puVar22 = puVar22 + lVar6;
    }
  }
  else {
    iVar25 = starty + 2;
    lVar8 = (long)startx;
    iVar23 = width * iVar25 + startx;
    puVar22 = img + (lVar16 * iVar25 + lVar8) * lVar6 + 2;
    bVar14 = 2;
    for (; puVar9 = puVar22, lVar13 = (long)iVar25, iVar3 = iVar23, lVar8 < startx + 4;
        lVar8 = lVar8 + 1) {
      for (; lVar13 < starty + 4; lVar13 = lVar13 + 1) {
        uVar24 = uVar19 >> (bVar14 & 0x1f);
        uVar7 = (uVar24 & 1) + (uVar15 >> (bVar14 & 0x1f) & 1) * 2;
        uVar24 = -((uVar24 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar7] * 4 + (ulong)((uVar20 & 0xe) << 4));
        iVar12 = uVar24 + uVar18;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        puVar9[-2] = (uint8)iVar12;
        iVar12 = uVar24 + uVar2;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        puVar9[-1] = (uint8)iVar12;
        iVar12 = uVar24 + uVar21;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        iVar10 = iVar3 << sVar1;
        *puVar9 = (uint8)iVar12;
        if (((uVar20 & 1) == 0) && (uVar7 == 2)) {
          puVar4[iVar10] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar4[iVar10] = 0xff;
        }
        bVar14 = bVar14 + 1;
        puVar9 = puVar9 + lVar6 * lVar16;
        iVar3 = iVar3 + width;
      }
      bVar14 = bVar14 + 2;
      iVar23 = iVar23 + 1;
      puVar22 = puVar22 + lVar6;
    }
  }
  return;
}

Assistant:

void decompressBlockDifferentialWithAlphaC(unsigned int block_part1, unsigned int block_part2, uint8* img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{
	
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;
  int channelsA;

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	//the diffbit now encodes whether or not the entire alpha channel is 255.
	diffbit = (GETBITSHIGH(block_part1, 1, 33));
 	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	// First decode left part of block.
	enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
	enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
	enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
	avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
	avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 39) << 1;

	unsigned int pixel_indices_MSB, pixel_indices_LSB;
		
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift = 0;
		for(int x=startx; x<startx+2; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];

				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}

			}
		}
	}
	else
	{
		// We should flip
		shift = 0;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty; y<starty+2; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift+=2;
		}
	}
	// Now decode right part of block. 
	diff[0]= GETBITSHIGH(block_part1, 3, 58);
	diff[1]= GETBITSHIGH(block_part1, 3, 50);
	diff[2]= GETBITSHIGH(block_part1, 3, 42);

	// Extend sign bit to entire byte. 
	diff[0] = (diff[0] << 5);
	diff[1] = (diff[1] << 5);
	diff[2] = (diff[2] << 5);
	diff[0] = diff[0] >> 5;
	diff[1] = diff[1] >> 5;
	diff[2] = diff[2] >> 5;

	//  Calculate second color
	enc_color2[0]= enc_color1[0] + diff[0];
	enc_color2[1]= enc_color1[1] + diff[1];
	enc_color2[2]= enc_color1[2] + diff[2];

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
	avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
	avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 36) << 1;
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift=8;
		for(int x=startx+2; x<startx+4; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
		}
	}
	else
	{
		// We should flip
		shift=2;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty+2; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift += 2;
		}
	}
}